

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O0

void __thiscall spdlog::logger::sink_it_(logger *this,log_msg *msg)

{
  bool bVar1;
  __shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  exception *ex;
  shared_ptr<spdlog::sinks::sink> *sink;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  *__range1;
  log_msg *msg_local;
  logger *this_local;
  
  __end1 = std::
           vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
           ::begin(&this->sinks_);
  sink = (shared_ptr<spdlog::sinks::sink> *)
         std::
         vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
         ::end(&this->sinks_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
                                     *)&sink), bVar1) {
    this_00 = (__shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
              ::operator*(&__end1);
    peVar2 = std::__shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    bVar1 = sinks::sink::should_log(peVar2,msg->level);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_00);
      (*peVar2->_vptr_sink[2])(peVar2,msg);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
    ::operator++(&__end1);
  }
  bVar1 = should_flush_(this,msg);
  if (bVar1) {
    (*this->_vptr_logger[4])();
  }
  return;
}

Assistant:

SPDLOG_INLINE void logger::sink_it_(const details::log_msg &msg) {
    for (auto &sink : sinks_) {
        if (sink->should_log(msg.level)) {
            SPDLOG_TRY { sink->log(msg); }
            SPDLOG_LOGGER_CATCH(msg.source)
        }
    }